

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O0

void __thiscall sparse_parameters::stride_shift(sparse_parameters *this,uint32_t stride_shift)

{
  float *pfVar1;
  uint32_t in_ESI;
  sparse_parameters *in_RDI;
  size_t in_stack_000001b8;
  
  in_RDI->_stride_shift = in_ESI;
  free(in_RDI->default_value);
  stride(in_RDI);
  pfVar1 = calloc_or_throw<float>(in_stack_000001b8);
  in_RDI->default_value = pfVar1;
  if (in_RDI->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
    (*in_RDI->fun)(in_RDI->default_value,in_RDI->default_data);
  }
  return;
}

Assistant:

void stride_shift(uint32_t stride_shift)
  {
    _stride_shift = stride_shift;
    free(default_value);
    default_value = calloc_mergable_or_throw<weight>(stride());
    if (fun != nullptr)
      fun(default_value, default_data);
  }